

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

bool __thiscall ArgsManager::UseDefaultSection(ArgsManager *this,string *arg)

{
  size_t __n;
  int iVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  bool bVar3;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ChainTypeToString_abi_cxx11_(&local_48,MAIN);
  __n = (this->m_network)._M_string_length;
  if (__n == local_48._M_string_length) {
    bVar3 = true;
    if (__n == 0) goto LAB_0013faff;
    iVar1 = bcmp((this->m_network)._M_dataplus._M_p,local_48._M_dataplus._M_p,__n);
    if (iVar1 == 0) goto LAB_0013faff;
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->m_network_only_args)._M_t,arg);
  bVar3 = (_Rb_tree_header *)cVar2._M_node ==
          &(this->m_network_only_args)._M_t._M_impl.super__Rb_tree_header;
LAB_0013faff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::UseDefaultSection(const std::string& arg) const
{
    return m_network == ChainTypeToString(ChainType::MAIN) || m_network_only_args.count(arg) == 0;
}